

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

int parse_args_SINCOS(Context *ctx)

{
  int iVar1;
  
  iVar1 = shader_version_atleast(ctx,'\x03','\0');
  if (iVar1 != 0) {
    iVar1 = parse_args_DS(ctx);
    return iVar1;
  }
  iVar1 = parse_args_DSSS(ctx);
  return iVar1;
}

Assistant:

static int parse_args_SINCOS(Context *ctx)
{
    // this opcode needs extra registers for sm2 and lower.
    if (!shader_version_atleast(ctx, 3, 0))
        return parse_args_DSSS(ctx);
    return parse_args_DS(ctx);
}